

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sphere.cpp
# Opt level: O0

ON_RevSurface * __thiscall
ON_Sphere::RevSurfaceForm(ON_Sphere *this,bool bArcLengthParameterization,ON_RevSurface *srf)

{
  double dVar1;
  bool bVar2;
  ON_ArcCurve *this_00;
  double local_130;
  double r;
  double local_120;
  double local_118;
  ON_ArcCurve *local_110;
  ON_ArcCurve *arc_curve;
  double dStack_100;
  double local_f8;
  ON_3dVector local_e0;
  undefined1 auStack_c8 [8];
  ON_Arc arc;
  ON_RevSurface *local_28;
  ON_RevSurface *pRevSurface;
  ON_RevSurface *srf_local;
  bool bArcLengthParameterization_local;
  ON_Sphere *this_local;
  
  if (srf != (ON_RevSurface *)0x0) {
    ON_RevSurface::Destroy(srf);
  }
  local_28 = (ON_RevSurface *)0x0;
  bVar2 = IsValid(this);
  if (bVar2) {
    ON_Arc::ON_Arc((ON_Arc *)auStack_c8);
    arc.super_ON_Circle.plane.origin.y = (this->plane).origin.z;
    auStack_c8 = (undefined1  [8])(this->plane).origin.x;
    arc.super_ON_Circle.plane.origin.x = (this->plane).origin.y;
    ON_3dVector::operator-(&local_e0,&(this->plane).zaxis);
    arc.super_ON_Circle.plane.xaxis.y = local_e0.z;
    arc.super_ON_Circle.plane.origin.z = local_e0.x;
    arc.super_ON_Circle.plane.xaxis.x = local_e0.y;
    arc.super_ON_Circle.plane.yaxis.y = (this->plane).xaxis.z;
    arc.super_ON_Circle.plane.xaxis.z = (this->plane).xaxis.x;
    arc.super_ON_Circle.plane.yaxis.x = (this->plane).xaxis.y;
    ON_3dVector::operator-((ON_3dVector *)&arc_curve,&(this->plane).yaxis);
    arc.super_ON_Circle.plane.zaxis.y = local_f8;
    arc.super_ON_Circle.plane.yaxis.z = (double)arc_curve;
    arc.super_ON_Circle.plane.zaxis.x = dStack_100;
    ON_Plane::UpdateEquation((ON_Plane *)auStack_c8);
    arc.super_ON_Circle.plane.plane_equation.d = this->radius;
    ON_Arc::SetAngleRadians((ON_Arc *)auStack_c8,3.141592653589793);
    this_00 = (ON_ArcCurve *)operator_new(0xc0);
    ON_ArcCurve::ON_ArcCurve(this_00,(ON_Arc *)auStack_c8,-1.5707963267948966,1.5707963267948966);
    local_110 = this_00;
    local_28 = srf;
    if (srf == (ON_RevSurface *)0x0) {
      local_28 = (ON_RevSurface *)operator_new(0xa0);
      ON_RevSurface::ON_RevSurface(local_28);
    }
    ON_Interval::Set(&local_28->m_angle,0.0,6.283185307179586);
    dVar1 = (local_28->m_angle).m_t[1];
    (local_28->m_t).m_t[0] = (local_28->m_angle).m_t[0];
    (local_28->m_t).m_t[1] = dVar1;
    local_28->m_curve = &local_110->super_ON_Curve;
    (local_28->m_axis).from.z = (this->plane).origin.z;
    dVar1 = (this->plane).origin.y;
    (local_28->m_axis).from.x = (this->plane).origin.x;
    (local_28->m_axis).from.y = dVar1;
    ON_3dPoint::operator+((ON_3dPoint *)&r,(ON_3dPoint *)this,&(this->plane).zaxis);
    (local_28->m_axis).to.x = r;
    (local_28->m_axis).to.y = local_120;
    (local_28->m_axis).to.z = local_118;
    local_28->m_bTransposed = false;
    (local_28->m_bbox).m_min.x = (this->plane).origin.x;
    (local_28->m_bbox).m_min.y = (this->plane).origin.y;
    (local_28->m_bbox).m_min.z = (this->plane).origin.z;
    (local_28->m_bbox).m_min.x = (local_28->m_bbox).m_min.x - this->radius;
    (local_28->m_bbox).m_min.y = (local_28->m_bbox).m_min.y - this->radius;
    (local_28->m_bbox).m_min.z = (local_28->m_bbox).m_min.z - this->radius;
    (local_28->m_bbox).m_max.x = (this->plane).origin.x;
    (local_28->m_bbox).m_max.y = (this->plane).origin.y;
    (local_28->m_bbox).m_max.z = (this->plane).origin.z;
    (local_28->m_bbox).m_max.x = this->radius + (local_28->m_bbox).m_max.x;
    (local_28->m_bbox).m_max.y = this->radius + (local_28->m_bbox).m_max.y;
    (local_28->m_bbox).m_max.z = this->radius + (local_28->m_bbox).m_max.z;
    if (bArcLengthParameterization) {
      local_130 = ABS(this->radius);
      if (local_130 <= 1.490116119385e-08) {
        local_130 = 1.0;
      }
      (*(local_28->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
                (local_28,0);
      (*(local_28->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
                (local_130 * 3.141592653589793 * -0.5,SUB84(local_130 * 3.141592653589793 * 0.5,0),
                 local_28,1);
    }
    ON_Arc::~ON_Arc((ON_Arc *)auStack_c8);
  }
  return local_28;
}

Assistant:

ON_RevSurface* ON_Sphere::RevSurfaceForm( 
  bool bArcLengthParameterization,
  ON_RevSurface* srf 
  ) const
{
  if ( srf )
    srf->Destroy();
  ON_RevSurface* pRevSurface = nullptr;
  if ( IsValid() )
  {
    ON_Arc arc;
    arc.plane.origin = plane.origin;
    arc.plane.xaxis = -plane.zaxis;
    arc.plane.yaxis =  plane.xaxis;
    arc.plane.zaxis = -plane.yaxis;
    arc.plane.UpdateEquation();
    arc.radius = radius;
    arc.SetAngleRadians(ON_PI);
    ON_ArcCurve* arc_curve = new ON_ArcCurve( arc, -0.5*ON_PI, 0.5*ON_PI );
    if ( srf )
      pRevSurface = srf;
    else
      pRevSurface = new ON_RevSurface();
    pRevSurface->m_angle.Set(0.0,2.0*ON_PI);
    pRevSurface->m_t = pRevSurface->m_angle;
    pRevSurface->m_curve = arc_curve;
    pRevSurface->m_axis.from = plane.origin;
    pRevSurface->m_axis.to = plane.origin + plane.zaxis;
    pRevSurface->m_bTransposed = false;
    pRevSurface->m_bbox.m_min = plane.origin;
    pRevSurface->m_bbox.m_min.x -= radius;
    pRevSurface->m_bbox.m_min.y -= radius;
    pRevSurface->m_bbox.m_min.z -= radius;
    pRevSurface->m_bbox.m_max = plane.origin;
    pRevSurface->m_bbox.m_max.x += radius;
    pRevSurface->m_bbox.m_max.y += radius;
    pRevSurface->m_bbox.m_max.z += radius;
    if ( bArcLengthParameterization )
    {
      double r = fabs(radius);
      if ( !(r > ON_SQRT_EPSILON) )
        r = 1.0;
      r *= ON_PI;
      pRevSurface->SetDomain(0,0.0,2.0*r);
      pRevSurface->SetDomain(1,-0.5*r,0.5*r);
    }
  }
  return pRevSurface;
}